

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileHelpers.cpp
# Opt level: O1

bool helics::fileops::looksLikeCommandLine(string_view testString)

{
  byte bVar1;
  size_type sVar2;
  byte *in_RSI;
  long in_RDI;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  if (in_RDI == 0) {
LAB_003f0e33:
    bVar3 = false;
  }
  else {
    bVar1 = *in_RSI;
    if (bVar1 < 0x5c) {
      if (bVar1 == 0x23) goto LAB_003f0e33;
      if (bVar1 == 0x2d) {
        return true;
      }
    }
    else if ((bVar1 == 0x5c) || (bVar1 == 0x7b)) goto LAB_003f0e33;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_10," -",0,2);
    bVar3 = sVar2 != 0xffffffffffffffff;
  }
  return bVar3;
}

Assistant:

bool looksLikeCommandLine(std::string_view testString)
{
    if (testString.empty()) {
        return false;
    }
    if (testString.front() == '-') {
        return true;
    }
    if (testString.front() == '\\' || testString.front() == '#' || testString.front() == '{') {
        return false;
    }
    return testString.find(" -") != std::string_view::npos;
}